

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  SpdLogger *this;
  IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator<char> local_15a;
  allocator<char> local_159;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  AppConfig config_storage;
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  Logger<std::shared_ptr<spdlog::logger>_> *local_b8;
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  Logger<std::shared_ptr<spdlog::logger>_> logger;
  
  this = (SpdLogger *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"ApplicationLog",&local_159)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&config_storage,"Log/log.txt",&local_15a);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            ((string *)local_158,(filename_t *)local_e8,SUB81(&config_storage,0));
  LogManager::Concretions::SpdLogger::SpdLogger(this,(shared_ptr<spdlog::logger> *)local_158);
  local_148 = (undefined1  [8])this;
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger
            (&logger,(ILogger<std::shared_ptr<spdlog::logger>_> **)local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  std::__cxx11::string::~string((string *)&config_storage);
  std::__cxx11::string::~string((string *)local_e8);
  this_00 = (IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Config",(allocator<char> *)local_148);
  ConfigManager::Concretions::ReadConfigCfg::ReadConfigCfg((ReadConfigCfg *)this_00,&local_108);
  local_e8._8_8_ = local_d8 + 8;
  local_d8._0_8_ = 0;
  local_d8[8] = '\0';
  local_e8._0_8_ = &PTR__Reader_0013cc70;
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  local_b8 = &logger;
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ReadConfigurations((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_78,
                     (Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_e8);
  ConfigManager::Configurations::AppConfig::AppConfig
            (&config_storage,
             (map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78);
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Reader
            ((Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  ClientFeederApplication::ClientFeederApplication
            ((ClientFeederApplication *)local_e8,&logger,&config_storage);
  iVar1 = ClientFeederApplication::Start((ClientFeederApplication *)local_e8);
  ClientFeederApplication::~ClientFeederApplication((ClientFeederApplication *)local_e8);
  ConfigManager::Configurations::
  IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~IConfigurationMap
            (&config_storage.
              super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::~Logger(&logger);
  return iVar1;
}

Assistant:

int main()
{
    auto logger = LogManager::Logger(
                std::move(new LogManager::Concretions::SpdLogger(
                              spdlog::basic_logger_mt("ApplicationLog", "Log/log.txt", true))));

    auto config_storage = ConfigManager::Configurations::AppConfig(
                ConfigManager::Reader(std::move(new ConfigManager::Concretions::ReadConfigCfg("Config")),
                                      logger)
                .ReadConfigurations());

    return ClientFeederApplication(logger, config_storage).Start();
}